

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O1

void OPENSSL_sk_pop_free_ex
               (OPENSSL_STACK *sk,OPENSSL_sk_call_free_func call_free_func,
               OPENSSL_sk_free_func free_func)

{
  ulong uVar1;
  
  if (sk != (OPENSSL_STACK *)0x0) {
    if (sk->num != 0) {
      uVar1 = 0;
      do {
        if (sk->data[uVar1] != (void *)0x0) {
          (*call_free_func)(free_func,sk->data[uVar1]);
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < sk->num);
    }
    OPENSSL_free(sk->data);
    OPENSSL_free(sk);
    return;
  }
  return;
}

Assistant:

void OPENSSL_sk_pop_free_ex(OPENSSL_STACK *sk,
                            OPENSSL_sk_call_free_func call_free_func,
                            OPENSSL_sk_free_func free_func) {
  if (sk == NULL) {
    return;
  }

  for (size_t i = 0; i < sk->num; i++) {
    if (sk->data[i] != NULL) {
      call_free_func(free_func, sk->data[i]);
    }
  }
  OPENSSL_sk_free(sk);
}